

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O0

DdNode * Llb_ImgComputeImage(Aig_Man_t *pAig,Vec_Ptr_t *vDdMans,DdManager *dd,DdNode *bInit,
                            Vec_Ptr_t *vQuant0,Vec_Ptr_t *vQuant1,Vec_Int_t *vDriRefs,
                            abctime TimeTarget,int fBackward,int fReorder,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  DdNode *pDVar5;
  DdManager *ddSource;
  DdNode *n;
  abctime aVar6;
  DdNode *pDVar7;
  Vec_Int_t *pVVar8;
  abctime aVar9;
  abctime clk0;
  abctime clk;
  int i;
  DdNode *bTemp;
  DdNode *bCube;
  DdNode *bGroup;
  DdNode *bImage;
  DdManager *ddPart;
  Vec_Ptr_t *vQuant1_local;
  Vec_Ptr_t *vQuant0_local;
  DdNode *bInit_local;
  DdManager *dd_local;
  Vec_Ptr_t *vDdMans_local;
  Aig_Man_t *pAig_local;
  
  aVar4 = Abc_Clock();
  Cudd_Ref(bInit);
  if (fBackward == 0) {
    pVVar8 = (Vec_Int_t *)Vec_PtrEntry(vQuant0,0);
    pDVar5 = Llb_ImgComputeCube(pAig,pVVar8,dd);
    Cudd_Ref(pDVar5);
    bGroup = Cudd_bddExistAbstract(dd,bInit,pDVar5);
    if (bGroup == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,bInit);
      Cudd_RecursiveDeref(dd,pDVar5);
      return (DdNode *)0x0;
    }
    Cudd_Ref(bGroup);
    Cudd_RecursiveDeref(dd,bInit);
    Cudd_RecursiveDeref(dd,pDVar5);
  }
  else {
    pDVar5 = Llb_DriverPhaseCube(pAig,vDriRefs,dd);
    Cudd_Ref(pDVar5);
    bGroup = Extra_bddChangePolarity(dd,bInit,pDVar5);
    Cudd_Ref(bGroup);
    Cudd_RecursiveDeref(dd,bInit);
    Cudd_RecursiveDeref(dd,pDVar5);
  }
  clk._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vDdMans);
    if (iVar1 <= (int)clk._4_4_) {
      if (fBackward == 0) {
        pDVar5 = Llb_DriverPhaseCube(pAig,vDriRefs,dd);
        Cudd_Ref(pDVar5);
        pDVar7 = Extra_bddChangePolarity(dd,bGroup,pDVar5);
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(dd,bGroup);
        Cudd_RecursiveDeref(dd,pDVar5);
        bGroup = pDVar7;
      }
      else {
        pVVar8 = (Vec_Int_t *)Vec_PtrEntry(vQuant0,0);
        pDVar5 = Llb_ImgComputeCube(pAig,pVVar8,dd);
        Cudd_Ref(pDVar5);
        pDVar7 = Cudd_bddExistAbstract(dd,bGroup,pDVar5);
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(dd,bGroup);
        Cudd_RecursiveDeref(dd,pDVar5);
        bGroup = pDVar7;
      }
      if (fReorder != 0) {
        if (fVerbose != 0) {
          uVar3 = Cudd_DagSize(bGroup);
          Abc_Print(1,"        Reordering... Before =%5d. ",(ulong)uVar3);
        }
        Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
        if (fVerbose != 0) {
          uVar3 = Cudd_DagSize(bGroup);
          Abc_Print(1,"After =%5d. ",(ulong)uVar3);
          aVar9 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar9 - aVar4);
        }
      }
      Cudd_Deref(bGroup);
      return bGroup;
    }
    ddSource = (DdManager *)Vec_PtrEntry(vDdMans,clk._4_4_);
    aVar9 = Abc_Clock();
    if (fVerbose != 0) {
      printf("   %2d : ",(ulong)clk._4_4_);
    }
    pDVar5 = Cudd_bddTransfer(ddSource,dd,ddSource->bFunc);
    if (pDVar5 == (DdNode *)0x0) break;
    Cudd_Ref(pDVar5);
    if (fVerbose != 0) {
      uVar3 = Cudd_DagSize(ddSource->bFunc);
      uVar2 = Cudd_DagSize(pDVar5);
      printf("Pt0 =%6d. Pt1 =%6d. ",(ulong)uVar3,(ulong)uVar2);
    }
    pVVar8 = (Vec_Int_t *)Vec_PtrEntry(vQuant1,clk._4_4_ + 1);
    pDVar7 = Llb_ImgComputeCube(pAig,pVVar8,dd);
    Cudd_Ref(pDVar7);
    n = Cudd_bddAndAbstract(dd,bGroup,pDVar5,pDVar7);
    if (n == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,bGroup);
      Cudd_RecursiveDeref(dd,pDVar7);
      Cudd_RecursiveDeref(dd,pDVar5);
      return (DdNode *)0x0;
    }
    Cudd_Ref(n);
    if (fVerbose != 0) {
      uVar3 = Cudd_DagSize(bGroup);
      uVar2 = Cudd_DagSize(n);
      printf("Im0 =%6d. Im1 =%6d. ",(ulong)uVar3,(ulong)uVar2);
    }
    Cudd_RecursiveDeref(dd,bGroup);
    Cudd_RecursiveDeref(dd,pDVar7);
    Cudd_RecursiveDeref(dd,pDVar5);
    if (fVerbose != 0) {
      Cudd_SupportSize(dd,n);
      printf("Supp =%3d. ");
      aVar6 = Abc_Clock();
      Abc_PrintTime(1,"T",aVar6 - aVar9);
    }
    clk._4_4_ = clk._4_4_ + 1;
    bGroup = n;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode * Llb_ImgComputeImage( Aig_Man_t * pAig, Vec_Ptr_t * vDdMans, DdManager * dd, DdNode * bInit, 
    Vec_Ptr_t * vQuant0, Vec_Ptr_t * vQuant1, Vec_Int_t * vDriRefs, 
    abctime TimeTarget, int fBackward, int fReorder, int fVerbose )
{
//    int fCheckSupport = 0;
    DdManager * ddPart;
    DdNode * bImage, * bGroup, * bCube, * bTemp;
    int i;
    abctime clk, clk0 = Abc_Clock();

    bImage = bInit;  Cudd_Ref( bImage );
    if ( fBackward )
    {
        // change polarity
        bCube  = Llb_DriverPhaseCube( pAig, vDriRefs, dd );                Cudd_Ref( bCube );
        bImage = Extra_bddChangePolarity( dd, bTemp = bImage, bCube );     Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    else
    {
        // quantify unique vriables
        bCube  = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant0, 0), dd ); Cudd_Ref( bCube );
        bImage = Cudd_bddExistAbstract( dd, bTemp = bImage, bCube );                    
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
            return NULL;
        }
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    // perform image computation
    Vec_PtrForEachEntry( DdManager *, vDdMans, ddPart, i )
    {
        clk = Abc_Clock();
if ( fVerbose )
printf( "   %2d : ", i );
        // transfer the BDD from the group manager to the main manager
        bGroup = Cudd_bddTransfer( ddPart, dd, ddPart->bFunc );                           
        if ( bGroup == NULL )
            return NULL;
        Cudd_Ref( bGroup );
if ( fVerbose )
printf( "Pt0 =%6d. Pt1 =%6d. ", Cudd_DagSize(ddPart->bFunc), Cudd_DagSize(bGroup) );
        // perform partial product
        bCube  = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant1, i+1), dd ); Cudd_Ref( bCube );
//        bImage = Cudd_bddAndAbstract( dd, bTemp = bImage, bGroup, bCube );                
//        bImage = Extra_bddAndAbstractTime( dd, bTemp = bImage, bGroup, bCube, TimeTarget );  
        bImage = Cudd_bddAndAbstract( dd, bTemp = bImage, bGroup, bCube );  
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
            Cudd_RecursiveDeref( dd, bGroup );
            return NULL;
        }
        Cudd_Ref( bImage );

if ( fVerbose )
printf( "Im0 =%6d. Im1 =%6d. ", Cudd_DagSize(bTemp), Cudd_DagSize(bImage) );
//printf("\n"); Extra_bddPrintSupport(dd, bImage); printf("\n");
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
        Cudd_RecursiveDeref( dd, bGroup );

//        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
//        Abc_Print( 1, "Reo =%6d.  ", Cudd_DagSize(bImage) );

if ( fVerbose )
printf( "Supp =%3d. ", Cudd_SupportSize(dd, bImage) );
if ( fVerbose )
Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    }

    if ( !fBackward )
    {
        // change polarity
        bCube  = Llb_DriverPhaseCube( pAig, vDriRefs, dd );                Cudd_Ref( bCube );
        bImage = Extra_bddChangePolarity( dd, bTemp = bImage, bCube );     Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    else
    {
        // quantify unique vriables
        bCube  = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant0, 0), dd ); Cudd_Ref( bCube );
        bImage = Cudd_bddExistAbstract( dd, bTemp = bImage, bCube );                    Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }

    if ( fReorder )
    {
    if ( fVerbose )
    Abc_Print( 1, "        Reordering... Before =%5d. ", Cudd_DagSize(bImage) );
    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
    if ( fVerbose )
    Abc_Print( 1, "After =%5d. ", Cudd_DagSize(bImage) );
//    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
//    Abc_Print( 1, "After =%5d.  ", Cudd_DagSize(bImage) );
    if ( fVerbose )
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk0 );
//    Abc_Print( 1, "\n" );
    }

    Cudd_Deref( bImage );
    return bImage;
}